

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

void __thiscall EDCircles::GenerateCandidateCircles(EDCircles *this)

{
  int noPoints;
  MyArc *pMVar1;
  bool bVar2;
  double dVar3;
  double local_88;
  double dStack_70;
  int noPixels;
  double coverRatio_1;
  double ellipseFitError;
  EllipseEquation eq;
  double coverRatio;
  int i;
  MyArc *arcs;
  EDCircles *this_local;
  
  pMVar1 = this->edarcs4->arcs;
  for (coverRatio._4_4_ = 0; coverRatio._4_4_ < this->edarcs4->noArcs;
      coverRatio._4_4_ = coverRatio._4_4_ + 1) {
    if ((pMVar1[coverRatio._4_4_].isEllipse & 1U) == 0) {
      if (0.25 < pMVar1[coverRatio._4_4_].coverRatio || pMVar1[coverRatio._4_4_].coverRatio == 0.25)
      {
        if ((((0.67 <= pMVar1[coverRatio._4_4_].coverRatio) &&
             (pMVar1[coverRatio._4_4_].circleFitError <= 1.5)) ||
            ((0.5 <= pMVar1[coverRatio._4_4_].coverRatio &&
             (pMVar1[coverRatio._4_4_].circleFitError <= 1.25)))) ||
           ((0.33 <= pMVar1[coverRatio._4_4_].coverRatio &&
            (pMVar1[coverRatio._4_4_].circleFitError <= 1.0)))) {
          addCircle(this->circles1,&this->noCircles1,pMVar1[coverRatio._4_4_].xc,
                    pMVar1[coverRatio._4_4_].yc,pMVar1[coverRatio._4_4_].r,
                    pMVar1[coverRatio._4_4_].circleFitError,pMVar1[coverRatio._4_4_].x,
                    pMVar1[coverRatio._4_4_].y,pMVar1[coverRatio._4_4_].noPixels);
        }
        else if (0.33 < pMVar1[coverRatio._4_4_].coverRatio ||
                 pMVar1[coverRatio._4_4_].coverRatio == 0.33) {
          EllipseEquation::EllipseEquation((EllipseEquation *)&ellipseFitError);
          coverRatio_1 = 10000000000.0;
          noPoints = pMVar1[coverRatio._4_4_].noPixels;
          bVar2 = EllipseFit(pMVar1[coverRatio._4_4_].x,pMVar1[coverRatio._4_4_].y,noPoints,
                             (EllipseEquation *)&ellipseFitError,1);
          if (bVar2) {
            coverRatio_1 = ComputeEllipseError((EllipseEquation *)&ellipseFitError,
                                               pMVar1[coverRatio._4_4_].x,pMVar1[coverRatio._4_4_].y
                                               ,noPoints);
            dVar3 = computeEllipsePerimeter((EllipseEquation *)&ellipseFitError);
            dStack_70 = (double)noPoints / dVar3;
          }
          if (dStack_70 < pMVar1[coverRatio._4_4_].coverRatio) {
            dStack_70 = pMVar1[coverRatio._4_4_].coverRatio;
          }
          if ((0.5 <= dStack_70) && (coverRatio_1 <= 1.5)) {
            addCircle(this->circles1,&this->noCircles1,pMVar1[coverRatio._4_4_].xc,
                      pMVar1[coverRatio._4_4_].yc,pMVar1[coverRatio._4_4_].r,
                      pMVar1[coverRatio._4_4_].circleFitError,(EllipseEquation *)&ellipseFitError,
                      coverRatio_1,pMVar1[coverRatio._4_4_].x,pMVar1[coverRatio._4_4_].y,
                      pMVar1[coverRatio._4_4_].noPixels);
          }
        }
      }
    }
    else if ((pMVar1[coverRatio._4_4_].coverRatio < 0.5) ||
            (1.5 < pMVar1[coverRatio._4_4_].ellipseFitError)) {
      dVar3 = ArcLength(pMVar1[coverRatio._4_4_].sTheta,pMVar1[coverRatio._4_4_].eTheta);
      if (pMVar1[coverRatio._4_4_].coverRatio <= dVar3 / 6.283185307179586) {
        local_88 = ArcLength(pMVar1[coverRatio._4_4_].sTheta,pMVar1[coverRatio._4_4_].eTheta);
        local_88 = local_88 / 6.283185307179586;
      }
      else {
        local_88 = pMVar1[coverRatio._4_4_].coverRatio;
      }
      eq.coeff[6] = local_88;
      if ((((0.67 <= local_88) && (pMVar1[coverRatio._4_4_].circleFitError <= 1.5)) ||
          ((0.5 <= local_88 && (pMVar1[coverRatio._4_4_].circleFitError <= 1.25)))) ||
         ((0.33 <= local_88 && (pMVar1[coverRatio._4_4_].circleFitError <= 1.0)))) {
        addCircle(this->circles1,&this->noCircles1,pMVar1[coverRatio._4_4_].xc,
                  pMVar1[coverRatio._4_4_].yc,pMVar1[coverRatio._4_4_].r,
                  pMVar1[coverRatio._4_4_].circleFitError,pMVar1[coverRatio._4_4_].x,
                  pMVar1[coverRatio._4_4_].y,pMVar1[coverRatio._4_4_].noPixels);
      }
    }
    else {
      addCircle(this->circles1,&this->noCircles1,pMVar1[coverRatio._4_4_].xc,
                pMVar1[coverRatio._4_4_].yc,pMVar1[coverRatio._4_4_].r,
                pMVar1[coverRatio._4_4_].circleFitError,&pMVar1[coverRatio._4_4_].eq,
                pMVar1[coverRatio._4_4_].ellipseFitError,pMVar1[coverRatio._4_4_].x,
                pMVar1[coverRatio._4_4_].y,pMVar1[coverRatio._4_4_].noPixels);
    }
  }
  return;
}

Assistant:

void EDCircles::GenerateCandidateCircles()
{
	// Now, go over the circular arcs & add them to circles1
	MyArc *arcs = edarcs4->arcs;
	for (int i = 0; i<edarcs4->noArcs; i++) {
		if (arcs[i].isEllipse) {
			// Ellipse
			if (arcs[i].coverRatio >= CANDIDATE_ELLIPSE_RATIO && arcs[i].ellipseFitError <= ELLIPSE_ERROR) {
				addCircle(circles1, noCircles1, arcs[i].xc, arcs[i].yc, arcs[i].r, arcs[i].circleFitError, &arcs[i].eq, arcs[i].ellipseFitError,
					arcs[i].x, arcs[i].y, arcs[i].noPixels);

			}
			else {
				//        double coverRatio = arcs[i].coverRatio;
				double coverRatio = MAX(ArcLength(arcs[i].sTheta, arcs[i].eTheta) / TWOPI, arcs[i].coverRatio);
				if ((coverRatio >= FULL_CIRCLE_RATIO && arcs[i].circleFitError <= LONG_ARC_ERROR) ||
					(coverRatio >= HALF_CIRCLE_RATIO && arcs[i].circleFitError <= HALF_ARC_ERROR) ||
					(coverRatio >= CANDIDATE_CIRCLE_RATIO2 && arcs[i].circleFitError <= SHORT_ARC_ERROR)) {
					addCircle(circles1, noCircles1, arcs[i].xc, arcs[i].yc, arcs[i].r, arcs[i].circleFitError, arcs[i].x, arcs[i].y, arcs[i].noPixels);
				} //end-if
			} //end-else

		}
		else {
			// If a very short arc, ignore
			if (arcs[i].coverRatio < CANDIDATE_CIRCLE_RATIO1) continue;

			// If the arc is long enough and the circleFitError is small enough, assume a circle
			if ((arcs[i].coverRatio >= FULL_CIRCLE_RATIO && arcs[i].circleFitError <= LONG_ARC_ERROR) ||
				(arcs[i].coverRatio >= HALF_CIRCLE_RATIO && arcs[i].circleFitError <= HALF_ARC_ERROR) ||
				(arcs[i].coverRatio >= CANDIDATE_CIRCLE_RATIO2 && arcs[i].circleFitError <= SHORT_ARC_ERROR)){

				addCircle(circles1, noCircles1, arcs[i].xc, arcs[i].yc, arcs[i].r, arcs[i].circleFitError, arcs[i].x, arcs[i].y, arcs[i].noPixels);

				continue;
			} //end-if

			if (arcs[i].coverRatio < CANDIDATE_CIRCLE_RATIO2) continue;

			// Circle is not possible. Try an ellipse
			EllipseEquation eq;
			double ellipseFitError = 1e10;
			double coverRatio;

			int noPixels = arcs[i].noPixels;
			if (EllipseFit(arcs[i].x, arcs[i].y, noPixels, &eq)) {
				ellipseFitError = ComputeEllipseError(&eq, arcs[i].x, arcs[i].y, noPixels);
				coverRatio = noPixels / computeEllipsePerimeter(&eq);
			} //end-if

			if (arcs[i].coverRatio > coverRatio) coverRatio = arcs[i].coverRatio;

			if (coverRatio >= CANDIDATE_ELLIPSE_RATIO && ellipseFitError <= ELLIPSE_ERROR) {
				addCircle(circles1, noCircles1, arcs[i].xc, arcs[i].yc, arcs[i].r, arcs[i].circleFitError, &eq, ellipseFitError, arcs[i].x, arcs[i].y, arcs[i].noPixels);
			} //end-if
			} //end-else
		} //end-for
}